

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O0

bool __thiscall features::sort(features *this,uint64_t parse_mask)

{
  feature_value fVar1;
  feature_index fVar2;
  ulong uVar3;
  size_t sVar4;
  float *pfVar5;
  unsigned_long *puVar6;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var7;
  feature_slice **ppfVar8;
  feature_slice *pfVar9;
  feature **ppfVar10;
  size_t sVar11;
  feature *pfVar12;
  ulong in_RSI;
  v_array<float> *in_RDI;
  size_t i_3;
  feature temp_1;
  size_t i_2;
  v_array<feature> slice_1;
  size_t i_1;
  feature_slice temp;
  size_t i;
  v_array<feature_slice> slice;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  float fVar13;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  size_t local_e8;
  feature local_e0;
  ulong local_d0;
  v_array<feature> local_c8;
  ulong local_a8;
  float local_90;
  ulong local_88;
  ulong local_40;
  v_array<feature_slice> local_38;
  ulong local_18;
  bool local_1;
  
  local_18 = in_RSI;
  sVar4 = v_array<unsigned_long>::size((v_array<unsigned_long> *)(in_RDI + 1));
  if (sVar4 == 0) {
    local_1 = false;
  }
  else {
    sVar4 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(in_RDI + 2));
    if (sVar4 == 0) {
      v_init<feature>();
      local_d0 = 0;
      while( true ) {
        uVar3 = local_d0;
        sVar4 = v_array<unsigned_long>::size((v_array<unsigned_long> *)(in_RDI + 1));
        if (sVar4 <= uVar3) break;
        pfVar5 = v_array<float>::operator[](in_RDI,local_d0);
        fVar13 = *pfVar5;
        puVar6 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDI + 1),local_d0)
        ;
        ::feature::feature(&local_e0,fVar13,*puVar6 & local_18);
        v_array<feature>::push_back
                  ((v_array<feature> *)in_stack_fffffffffffffeb0,
                   (feature *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        local_d0 = local_d0 + 1;
      }
      ppfVar10 = v_array<feature>::begin(&local_c8);
      pfVar12 = *ppfVar10;
      sVar4 = v_array<feature>::size(&local_c8);
      qsort(pfVar12,sVar4,0x10,order_features<feature>);
      local_e8 = 0;
      while( true ) {
        sVar4 = local_e8;
        sVar11 = v_array<feature>::size(&local_c8);
        if (sVar11 <= sVar4) break;
        pfVar12 = v_array<feature>::operator[](&local_c8,local_e8);
        fVar13 = pfVar12->x;
        pfVar5 = v_array<float>::operator[](in_RDI,local_e8);
        *pfVar5 = fVar13;
        pfVar12 = v_array<feature>::operator[](&local_c8,local_e8);
        in_stack_fffffffffffffeb0 =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pfVar12->weight_index;
        puVar6 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDI + 1),local_e8)
        ;
        *puVar6 = (unsigned_long)in_stack_fffffffffffffeb0;
        local_e8 = local_e8 + 1;
      }
      v_array<feature>::delete_v((v_array<feature> *)in_stack_fffffffffffffeb0);
    }
    else {
      v_init<feature_slice>();
      local_40 = 0;
      while( true ) {
        uVar3 = local_40;
        sVar4 = v_array<unsigned_long>::size((v_array<unsigned_long> *)(in_RDI + 1));
        if (sVar4 <= uVar3) break;
        pfVar5 = v_array<float>::operator[](in_RDI,local_40);
        local_90 = *pfVar5;
        puVar6 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDI + 1),local_40)
        ;
        local_88 = *puVar6 & local_18;
        p_Var7 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)(in_RDI + 2),local_40)->
                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
        std::
        __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::get(p_Var7);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        v_array<feature_slice>::push_back
                  ((v_array<feature_slice> *)in_stack_fffffffffffffeb0,
                   (feature_slice *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        feature_slice::~feature_slice((feature_slice *)0x25e354);
        local_40 = local_40 + 1;
      }
      ppfVar8 = v_array<feature_slice>::begin(&local_38);
      pfVar9 = *ppfVar8;
      sVar4 = v_array<feature_slice>::size(&local_38);
      qsort(pfVar9,sVar4,0x50,order_features<feature_slice>);
      local_a8 = 0;
      while( true ) {
        uVar3 = local_a8;
        sVar4 = v_array<feature_slice>::size(&local_38);
        if (sVar4 <= uVar3) break;
        pfVar9 = v_array<feature_slice>::operator[](&local_38,local_a8);
        fVar1 = pfVar9->x;
        pfVar5 = v_array<float>::operator[](in_RDI,local_a8);
        *pfVar5 = fVar1;
        pfVar9 = v_array<feature_slice>::operator[](&local_38,local_a8);
        fVar2 = pfVar9->weight_index;
        puVar6 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDI + 1),local_a8)
        ;
        *puVar6 = fVar2;
        v_array<feature_slice>::operator[](&local_38,local_a8);
        p_Var7 = &v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)(in_RDI + 2),local_a8)->
                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
        std::
        __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::get(p_Var7);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(in_stack_fffffffffffffeb0,
                    (type)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        local_a8 = local_a8 + 1;
      }
      v_array<feature_slice>::delete_v((v_array<feature_slice> *)in_stack_fffffffffffffeb0);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool sort(uint64_t parse_mask)
  {
    if (indicies.size() == 0)
      return false;

    if (space_names.size() != 0)
    {
      v_array<feature_slice> slice = v_init<feature_slice>();
      for (size_t i = 0; i < indicies.size(); i++)
      {
        feature_slice temp = {values[i], indicies[i] & parse_mask, *space_names[i].get()};
        slice.push_back(temp);
      }
      qsort(slice.begin(), slice.size(), sizeof(feature_slice), order_features<feature_slice>);
      for (size_t i = 0; i < slice.size(); i++)
      {
        values[i] = slice[i].x;
        indicies[i] = slice[i].weight_index;
        *space_names[i].get() = slice[i].space_name;
      }
      slice.delete_v();
    }
    else
    {
      v_array<feature> slice = v_init<feature>();
      for (size_t i = 0; i < indicies.size(); i++)
      {
        feature temp = {values[i], indicies[i] & parse_mask};
        slice.push_back(temp);
      }
      qsort(slice.begin(), slice.size(), sizeof(feature), order_features<feature>);
      for (size_t i = 0; i < slice.size(); i++)
      {
        values[i] = slice[i].x;
        indicies[i] = slice[i].weight_index;
      }
      slice.delete_v();
    }
    return true;
  }